

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_node_tec(REF_GEOM ref_geom,char *filename)

{
  uint uVar1;
  FILE *__stream;
  REF_STATUS ref_private_macro_code_rss;
  FILE *file;
  REF_DBL xyz [3];
  int local_24;
  REF_INT i;
  char *filename_local;
  REF_GEOM ref_geom_local;
  
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x11c7,
           "ref_geom_node_tec","unable to open file");
    ref_geom_local._4_4_ = 2;
  }
  else {
    fprintf(__stream,"title=\"refine node\"\n");
    fprintf(__stream,"variables = \"x\" \"y\" \"z\" \"id\"\n");
    fprintf(__stream,"zone t=\"node\", i=%d, datapacking=%s\n",(ulong)(uint)ref_geom->nnode,"point")
    ;
    for (local_24 = 0; local_24 < ref_geom->nnode; local_24 = local_24 + 1) {
      uVar1 = ref_egads_eval_at(ref_geom,0,local_24 + 1,(REF_DBL *)0x0,(REF_DBL *)&file,
                                (REF_DBL *)0x0);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x11cf,"ref_geom_node_tec",(ulong)uVar1,"eval edge");
        return uVar1;
      }
      fprintf(__stream,"%f %f %f %d\n",file,xyz[0],xyz[1],(ulong)(local_24 + 1));
    }
    fclose(__stream);
    ref_geom_local._4_4_ = 0;
  }
  return ref_geom_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_node_tec(REF_GEOM ref_geom, const char *filename) {
  REF_INT i;
  REF_DBL xyz[3];
  FILE *file;

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"refine node\"\n");
  fprintf(file, "variables = \"x\" \"y\" \"z\" \"id\"\n");
  fprintf(file, "zone t=\"node\", i=%d, datapacking=%s\n", ref_geom->nnode,
          "point");
  for (i = 0; i < ref_geom->nnode; i++) {
    RSS(ref_egads_eval_at(ref_geom, REF_GEOM_NODE, i + 1, NULL, xyz, NULL),
        "eval edge");
    fprintf(file, "%f %f %f %d\n", xyz[0], xyz[1], xyz[2], i + 1);
  }
  fclose(file);
  return REF_SUCCESS;
}